

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

uintptr_t __thiscall google::protobuf::internal::MessageCreator::arena_bits(MessageCreator *this)

{
  string *psVar1;
  LogMessageFatal aLStack_18 [16];
  
  psVar1 = absl::lts_20240722::log_internal::Check_NEImpl_abi_cxx11_
                     ((int)this->tag_,-1,"+tag() != +kFunc");
  if (psVar1 == (string *)0x0) {
    return (uintptr_t)(this->field_3).func_;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message_lite.h"
             ,0x8a,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

uintptr_t arena_bits() const {
    ABSL_DCHECK_NE(+tag(), +kFunc);
    return arena_bits_;
  }